

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall
Js::DebuggerScope::AddProperty
          (DebuggerScope *this,RegSlot location,PropertyId propertyId,
          DebuggerScopePropertyFlags flags)

{
  Type *pTVar1;
  int iVar2;
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  DebuggerScopeProperty *pDVar3;
  
  EnsurePropertyListIsAllocated(this);
  this_00 = (this->scopeProperties).ptr;
  JsUtil::
  List<Js::DebuggerScopeProperty,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(this_00,0);
  pDVar3 = (this_00->
           super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).buffer.
           ptr;
  iVar2 = (this_00->super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>
          ).count;
  pDVar3[iVar2].propId = propertyId;
  pDVar3[iVar2].location = location;
  pDVar3[iVar2].byteCodeInitializationOffset = -1;
  pDVar3[iVar2].flags = flags;
  pTVar1 = &(this_00->
            super_ReadOnlyList<Js::DebuggerScopeProperty,_Memory::Recycler,_DefaultComparer>).count;
  *pTVar1 = *pTVar1 + 1;
  return;
}

Assistant:

void DebuggerScope::AddProperty(RegSlot location, Js::PropertyId propertyId, DebuggerScopePropertyFlags flags)
    {
        DebuggerScopeProperty scopeProperty;

        scopeProperty.location = location;
        scopeProperty.propId = propertyId;

        // This offset is uninitialized until the property is initialized (with a ld opcode, for example).
        scopeProperty.byteCodeInitializationOffset = Constants::InvalidByteCodeOffset;
        scopeProperty.flags = flags;

        // Delay allocate the property list so we don't take up memory if there are no properties in this scope.
        // Scopes are created during non-debug mode as well so we want to keep them as small as possible.
        this->EnsurePropertyListIsAllocated();

        // The property doesn't exist yet, so add it.
        this->scopeProperties->Add(scopeProperty);
    }